

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::base::
CircularQueue<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
::Grow(CircularQueue<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
       *this,size_t new_capacity)

{
  long lVar1;
  void *pvVar2;
  vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  *pvVar3;
  unsigned_long uVar4;
  pointer ppVar5;
  _Head_base<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_false>
  _Var6;
  pair<unsigned_int,_unsigned_long> *ppVar7;
  _Head_base<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_false>
  _Var8;
  size_type __n;
  _Head_base<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_false>
  _Var9;
  pointer *pppVar10;
  ulong uVar11;
  undefined8 *extraout_RDX;
  ulong uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  _Head_base<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_false>
  _Var15;
  ulong uVar16;
  
  uVar16 = this->capacity_ * 2;
  if (new_capacity != 0) {
    uVar16 = new_capacity;
  }
  if ((uVar16 & uVar16 - 1) == 0) {
    if (this->capacity_ < uVar16) {
      _Var8._M_head_impl =
           (vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
            *)AlignedAlloc(8,uVar16 * 0x18);
      uVar11 = this->begin_;
      if (uVar11 < this->end_) {
        pppVar10 = (pointer *)
                   ((long)&(_Var8._M_head_impl)->
                           super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                   + 0x10);
        uVar13 = 0;
        do {
          _Var9._M_head_impl =
               (this->entries_)._M_t.
               super___uniq_ptr_impl<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>,_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
               .
               super__Head_base<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_false>
               ._M_head_impl;
          uVar12 = this->capacity_ - 1 & uVar11 + uVar13;
          ((_Vector_impl_data *)(pppVar10 + -2))->_M_start =
               (pointer)*(undefined8 *)
                         &_Var9._M_head_impl[uVar12].
                          super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
          ;
          pppVar10[-1] = *(pointer *)((long)(_Var9._M_head_impl + uVar12) + 8);
          *pppVar10 = *(pointer *)((long)(_Var9._M_head_impl + uVar12) + 0x10);
          *(undefined8 *)
           &_Var9._M_head_impl[uVar12].
            super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
               = 0;
          *(pointer *)
           ((long)&_Var9._M_head_impl[uVar12].
                   super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
           + 8) = (pointer)0x0;
          *(pointer *)((long)(_Var9._M_head_impl + uVar12) + 0x10) = (pointer)0x0;
          lVar1 = uVar11 + uVar13;
          uVar13 = uVar13 + 1;
          pppVar10 = pppVar10 + 3;
        } while (lVar1 + 1U < this->end_);
      }
      else {
        uVar13 = 0;
      }
      for (uVar14 = this->begin_; uVar14 < this->end_; uVar14 = uVar14 + 1) {
        _Var9._M_head_impl =
             (this->entries_)._M_t.
             super___uniq_ptr_impl<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>,_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
             .
             super__Head_base<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_false>
             ._M_head_impl;
        uVar11 = this->capacity_ - 1 & uVar14;
        pvVar2 = *(void **)&_Var9._M_head_impl[uVar11].
                            super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
        ;
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2,(long)*(pointer *)((long)(_Var9._M_head_impl + uVar11) + 0x10) -
                                 (long)pvVar2);
        }
      }
      this->begin_ = 0;
      this->end_ = uVar13;
      this->capacity_ = uVar16;
      _Var9._M_head_impl =
           (this->entries_)._M_t.
           super___uniq_ptr_impl<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>,_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
           .
           super__Head_base<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_false>
           ._M_head_impl;
      (this->entries_)._M_t.
      super___uniq_ptr_impl<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>,_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
      .
      super__Head_base<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_false>
      ._M_head_impl = _Var8._M_head_impl;
      if (_Var9._M_head_impl ==
          (vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
           *)0x0) {
        return;
      }
      free(_Var9._M_head_impl);
      return;
    }
  }
  else {
    CircularQueue<std::vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>>
    ::Grow();
  }
  CircularQueue<std::vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>>
  ::Grow();
  __n = std::
        vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
        ::_M_check_len((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                        *)this,1,"vector::_M_realloc_insert");
  _Var8._M_head_impl =
       (this->entries_)._M_t.
       super___uniq_ptr_impl<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>,_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
       .
       super__Head_base<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_false>
       ._M_head_impl;
  pvVar3 = (vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
            *)this->capacity_;
  if (__n == 0) {
    _Var9._M_head_impl =
         (vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
          *)0x0;
  }
  else {
    _Var9._M_head_impl =
         (vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
          *)__gnu_cxx::new_allocator<std::pair<unsigned_int,_unsigned_long>_>::allocate
                      ((new_allocator<std::pair<unsigned_int,_unsigned_long>_> *)this,__n,
                       (void *)0x0);
  }
  uVar4 = extraout_RDX[1];
  ppVar7 = (pair<unsigned_int,_unsigned_long> *)
           ((long)&(_Var9._M_head_impl)->
                   super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
           + ((long)(new_capacity - (long)_Var8._M_head_impl) >> 4) * 0x10);
  *(undefined8 *)ppVar7 = *extraout_RDX;
  ppVar7->second = uVar4;
  _Var15._M_head_impl = _Var9._M_head_impl;
  for (_Var6._M_head_impl = _Var8._M_head_impl;
      _Var6._M_head_impl !=
      (vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
       *)new_capacity;
      _Var6._M_head_impl =
           (vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
            *)((long)_Var6._M_head_impl + 0x10)) {
    ppVar5 = *(pointer *)
              &((_Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                 *)((long)_Var6._M_head_impl + 8))->_M_impl;
    *(undefined8 *)&((pair<unsigned_int,_unsigned_long> *)_Var15._M_head_impl)->first =
         *(undefined8 *)_Var6._M_head_impl;
    ((pair<unsigned_int,_unsigned_long> *)_Var15._M_head_impl)->second = (unsigned_long)ppVar5;
    _Var15._M_head_impl =
         (vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
          *)((long)_Var15._M_head_impl + 0x10);
  }
  for (; ppVar7 = (pair<unsigned_int,_unsigned_long> *)((long)_Var15._M_head_impl + 0x10),
      pvVar3 != (vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                 *)new_capacity; new_capacity = new_capacity + 0x10) {
    ppVar5 = *(pointer *)(new_capacity + 8);
    *(undefined8 *)ppVar7 = *(undefined8 *)new_capacity;
    ((pair<unsigned_int,_unsigned_long> *)((long)_Var15._M_head_impl + 0x10))->second =
         (unsigned_long)ppVar5;
    _Var15._M_head_impl =
         (vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
          *)ppVar7;
  }
  if (_Var8._M_head_impl !=
      (vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
       *)0x0) {
    operator_delete(_Var8._M_head_impl,this->begin_ - (long)_Var8._M_head_impl);
  }
  (this->entries_)._M_t.
  super___uniq_ptr_impl<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>,_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
  .
  super__Head_base<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_false>
  ._M_head_impl = _Var9._M_head_impl;
  this->capacity_ = (size_t)ppVar7;
  this->begin_ = (uint64_t)
                 ((long)&(_Var9._M_head_impl)->
                         super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                 + __n * 0x10);
  return;
}

Assistant:

void Grow(size_t new_capacity = 0) {
    // Capacity must be always a power of two. This allows Get() to use a simple
    // bitwise-AND for handling the wrapping instead of a full division.
    new_capacity = new_capacity ? new_capacity : capacity_ * 2;
    PERFETTO_CHECK((new_capacity & (new_capacity - 1)) == 0);  // Must be pow2.

    // On 32-bit systems this might hit the 4GB wall and overflow. We can't do
    // anything other than crash in this case.
    PERFETTO_CHECK(new_capacity > capacity_);

    AlignedUniquePtr<T[]> new_vec = AlignedAllocTyped<T[]>(new_capacity);

    // Move all elements in the expanded array.
    size_t new_size = 0;
    for (uint64_t i = begin_; i < end_; i++)
      new (&new_vec[new_size++]) T(std::move(*Get(i)));  // Placement move ctor.

    // Even if all the elements are std::move()-d and likely empty, we are still
    // required to call the dtor for them.
    for (uint64_t i = begin_; i < end_; i++)
      Get(i)->~T();

    begin_ = 0;
    end_ = new_size;
    capacity_ = new_capacity;
    entries_ = std::move(new_vec);
  }